

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSONObjectinfo(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  pointer this_00;
  allocator<char> local_19c;
  bool first_object;
  allocator<char> local_19a;
  allocator<char> local_199;
  QPDFObjectHandle local_198;
  QPDFJob *local_188;
  JSON j_stream;
  JSON j_details;
  undefined1 local_148 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [2];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_108;
  QPDFObjectHandle local_f0;
  QPDFObjectHandle local_e0;
  set wanted_og;
  JSON local_a0;
  JSON local_90;
  JSON local_80;
  string local_70 [32];
  string local_50 [32];
  
  local_188 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wanted_og,"objectinfo",(allocator<char> *)local_128[0]._M_local_buf);
  JSON::writeDictionaryKey(p,first,(string *)&wanted_og,1);
  std::__cxx11::string::~string((string *)&wanted_og);
  first_object = true;
  JSON::writeDictionaryOpen(p,&first_object,1);
  sVar1 = *(size_t *)
           ((long)&(((local_188->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->json_objects)._M_t._M_impl.super__Rb_tree_header + 0x20);
  getWantedJSONObjects(&wanted_og,local_188);
  QPDF::getAllObjects(&local_108,pdf);
  this_00 = local_108.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_00 ==
        local_108.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_108);
      JSON::writeDictionaryClose(p,first_object,1);
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   *)&wanted_og);
      return;
    }
    if (sVar1 == 0) {
LAB_001648b5:
      JSON::makeDictionary();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128[0]._M_local_buf,"stream",&local_19c);
      JSON::makeDictionary();
      JSON::addDictionaryMember(&j_stream,(string *)&j_details,(JSON *)local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_198.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_128[0]._M_local_buf);
      bVar2 = QPDFObjectHandle::isStream(this_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128[0]._M_local_buf,"is",&local_19c);
      JSON::makeBool(false);
      JSON::addDictionaryMember(&local_80,(string *)&j_stream,(JSON *)local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_198.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_128[0]._M_local_buf);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128[0]._M_local_buf,"length",&local_19c);
      if (bVar2) {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_148 + 0x10));
        std::__cxx11::string::string<std::allocator<char>>(local_50,"/Length",&local_199);
        QPDFObjectHandle::getKey(&local_e0,(string *)(local_148 + 0x10));
        QPDFObjectHandle::getJSON
                  (&local_198,(int)&local_e0,
                   SUB41(((local_188->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
      }
      else {
        JSON::makeNull();
      }
      JSON::addDictionaryMember(&local_90,(string *)&j_stream,(JSON *)local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_198.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (bVar2) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string(local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130);
      }
      std::__cxx11::string::~string((string *)local_128[0]._M_local_buf);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128[0]._M_local_buf,"filter",&local_19c);
      if (bVar2) {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)local_148);
        std::__cxx11::string::string<std::allocator<char>>(local_70,"/Filter",&local_19a);
        QPDFObjectHandle::getKey(&local_f0,(string *)local_148);
        QPDFObjectHandle::getJSON
                  (&local_198,(int)&local_f0,
                   SUB41(((local_188->m).
                          super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         json_version,0));
      }
      else {
        JSON::makeNull();
      }
      JSON::addDictionaryMember(&local_a0,(string *)&j_stream,(JSON *)local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_198.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (bVar2) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_f0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string(local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
      }
      std::__cxx11::string::~string((string *)local_128[0]._M_local_buf);
      QPDFObjectHandle::unparse_abi_cxx11_((string *)local_128,this_00);
      JSON::writeDictionaryItem(p,&first_object,(string *)local_128,&j_details,2);
      std::__cxx11::string::~string((string *)local_128[0]._M_local_buf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&j_stream.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&j_details.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      local_128[0]._0_8_ = QPDFObjectHandle::getObjGen(this_00);
      sVar3 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                        (&wanted_og.
                          super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,
                         (key_type *)&local_128[0]._M_allocated_capacity);
      if (sVar3 != 0) goto LAB_001648b5;
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void
QPDFJob::doJSONObjectinfo(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON::writeDictionaryKey(p, first, "objectinfo", 1);
    bool first_object = true;
    JSON::writeDictionaryOpen(p, first_object, 1);
    bool all_objects = m->json_objects.empty();
    auto wanted_og = getWantedJSONObjects();
    for (auto& obj: pdf.getAllObjects()) {
        if (all_objects || wanted_og.count(obj.getObjGen())) {
            auto j_details = JSON::makeDictionary();
            auto j_stream = j_details.addDictionaryMember("stream", JSON::makeDictionary());
            bool is_stream = obj.isStream();
            j_stream.addDictionaryMember("is", JSON::makeBool(is_stream));
            j_stream.addDictionaryMember(
                "length",
                (is_stream ? obj.getDict().getKey("/Length").getJSON(m->json_version, true)
                           : JSON::makeNull()));
            j_stream.addDictionaryMember(
                "filter",
                (is_stream ? obj.getDict().getKey("/Filter").getJSON(m->json_version, true)
                           : JSON::makeNull()));
            JSON::writeDictionaryItem(p, first_object, obj.unparse(), j_details, 2);
        }
    }
    JSON::writeDictionaryClose(p, first_object, 1);
}